

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O0

TPZAutoPointer<TPZRefPattern> __thiscall
TPZIdentifyRefPattern::GetRefPattern
          (TPZIdentifyRefPattern *this,TPZGeoEl *father,TPZVec<TPZGeoEl_*> *subelem)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  ostream *poVar4;
  TPZVec<TPZGeoEl_*> *in_RCX;
  TPZVec<TPZGeoEl_*> *in_RDX;
  TPZRefPatternDataBase *in_RDI;
  TPZAutoPointer<TPZRefPattern> mesh_rp;
  int side;
  TPZRefPattern *newRef;
  TPZAutoPointer<TPZRefPattern> rp;
  int nelem;
  MElementType eltype;
  string *in_stack_00000138;
  TPZRefPattern *in_stack_00000140;
  TPZVec<TPZGeoEl_*> *in_stack_00000188;
  TPZGeoEl *in_stack_00000190;
  TPZIdentifyRefPattern *in_stack_00000198;
  size_t in_stack_00000308;
  char *in_stack_00000310;
  TPZAutoPointer<TPZRefPattern> *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TPZIdentifyRefPattern *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int iVar5;
  undefined4 in_stack_ffffffffffffff04;
  TPZRefPattern *in_stack_ffffffffffffff08;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffff10;
  allocator<char> *in_stack_ffffffffffffff20;
  TPZRefPatternDataBase *this_00;
  TPZAutoPointer<TPZRefPattern> in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  TPZGeoEl *in_stack_ffffffffffffff60;
  TPZIdentifyRefPattern *in_stack_ffffffffffffff68;
  undefined1 local_69 [33];
  TPZAutoPointer<TPZRefPattern> *local_48;
  undefined4 local_40;
  TPZAutoPointer<TPZRefPattern> local_30;
  int local_28;
  int local_24;
  TPZVec<TPZGeoEl_*> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_24 = (*in_RDX->_vptr_TPZVec[0x17])();
  iVar3 = TPZVec<TPZGeoEl_*>::NElements(in_RCX);
  local_28 = (int)iVar3;
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if (local_24 == 0) {
    if (local_28 != 1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TPZIdentifyRefPattern::GetRefPattern ERROR : point partition detected!"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pzinternal::DebugStopImpl(in_stack_00000310,in_stack_00000308);
    }
    TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_40 = 1;
  }
  else {
    if (local_24 == 1) {
      if (local_28 != 2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "TPZIdentifyRefPattern::GetRefPattern ERROR : wrong linear partition detected!"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_00000310,in_stack_00000308);
      }
      in_stack_ffffffffffffff10 = (TPZAutoPointer<TPZRefPattern> *)operator_new(0x360);
      in_stack_ffffffffffffff08 = (TPZRefPattern *)local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (char *)in_RDI,in_stack_ffffffffffffff20);
      TPZRefPattern::TPZRefPattern(in_stack_00000140,in_stack_00000138);
      std::__cxx11::string::~string((string *)(local_69 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_69);
      local_48 = in_stack_ffffffffffffff10;
      TPZAutoPointer<TPZRefPattern>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    iVar5 = local_28;
    iVar2 = UniformSubElem(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    if (iVar5 == iVar2) {
      GetUniform(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      TPZAutoPointer<TPZRefPattern>::operator=
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    else {
      TPZVec<TPZGeoEl_*>::TPZVec((TPZVec<TPZGeoEl_*> *)CONCAT44(iVar2,iVar5),local_18);
      in_stack_fffffffffffffef4 =
           IdentifySide(in_stack_00000198,in_stack_00000190,in_stack_00000188);
      TPZVec<TPZGeoEl_*>::~TPZVec
                ((TPZVec<TPZGeoEl_*> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                );
      GetSideRefPattern(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff5c);
      TPZAutoPointer<TPZRefPattern>::operator=
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    TPZRefPatternDataBase::FindRefPattern
              ((TPZRefPatternDataBase *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (TPZAutoPointer<TPZRefPattern> *)in_stack_ffffffffffffff50.fRef);
    bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&stack0xffffffffffffff50);
    in_stack_fffffffffffffef0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef0);
    if (bVar1) {
      TPZAutoPointer<TPZRefPattern>::operator->
                ((TPZAutoPointer<TPZRefPattern> *)&stack0xffffffffffffff50);
      TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      TPZRefPatternDataBase::InsertRefPattern(this_00,(TPZAutoPointer<TPZRefPattern> *)in_RDI);
      TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)in_RDI,&local_30);
    }
    local_40 = 1;
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this_00;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZIdentifyRefPattern::GetRefPattern (TPZGeoEl *father, TPZVec<TPZGeoEl *> subelem){
	MElementType eltype =  father->Type();
	int nelem = subelem.NElements();
	TPZAutoPointer<TPZRefPattern> rp;
	switch (eltype) {
		case (EPoint) : {
			if (nelem != 1){
				PZError << "TPZIdentifyRefPattern::GetRefPattern ERROR : point partition detected!" << endl;
				DebugStop();
			}
			return 0;// return refpattern for point!!
		}
		case (EOned) :{
			if (nelem != 2){
				PZError << "TPZIdentifyRefPattern::GetRefPattern ERROR : wrong linear partition detected!" << endl;
				DebugStop();
			}
			TPZRefPattern * newRef = new TPZRefPattern ("/home/pos/cesar/RefPattern/Unif_Linear.rpt");
			rp = newRef;
		}
		default : {
			//return a uniform refinement pattern
			if (nelem == UniformSubElem(eltype)) {
				rp = GetUniform(father);
			} else {
				//identify the side refinement pattern
				int side = IdentifySide(father,subelem);
				rp = GetSideRefPattern(father,side);
			}
		}
	}
	TPZAutoPointer<TPZRefPattern> mesh_rp = gRefDBase.FindRefPattern(rp);
	//If the refinement pattern is already defined delete the created refinement pattern
	if (mesh_rp) {
		return mesh_rp.operator->();
	}
	//Insert a new refinement pattern into mesh
	gRefDBase.InsertRefPattern(rp);
	return rp;
}